

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

void __thiscall
wasm::
removeModuleElement<std::vector<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>,std::allocator<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>>>,std::unordered_map<wasm::Name,wasm::Export*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Export*>>>>
          (wasm *this,
          vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          *v,unordered_map<wasm::Name,_wasm::Export_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Export_*>_>_>
             *m,Name name)

{
  long lVar1;
  iterator __position;
  Name name_local;
  
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Export_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Export_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_erase((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Export_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Export_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)v);
  __position._M_current = *(unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> **)this;
  if (*(long *)(this + 8) - (long)__position._M_current != 0) {
    lVar1 = *(long *)(this + 8) - (long)__position._M_current >> 3;
    lVar1 = lVar1 + (ulong)(lVar1 == 0);
    do {
      if (*(char **)((long)&((((__position._M_current)->_M_t).
                              super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                              .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->name).
                            super_IString + 8) == name.super_IString.str._M_len) {
        std::
        vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ::_M_erase((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    *)this,__position);
        return;
      }
      __position._M_current = __position._M_current + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

void removeModuleElement(Vector& v, Map& m, Name name) {
  m.erase(name);
  for (size_t i = 0; i < v.size(); i++) {
    if (v[i]->name == name) {
      v.erase(v.begin() + i);
      break;
    }
  }
}